

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int cmsys::SystemTools::GetTerminalWidth(void)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *__nptr;
  char *local_58;
  char *endptr;
  long t;
  undefined1 local_38 [8];
  string columns;
  winsize ws;
  int width;
  
  ws.ws_row = 0xffff;
  ws.ws_col = 0xffff;
  std::__cxx11::string::string((string *)local_38);
  iVar2 = ioctl(1,0x5413,(undefined1 *)((long)&columns.field_2 + 0xc));
  if (((iVar2 != -1) && (columns.field_2._14_2_ != 0)) && (columns.field_2._12_2_ != 0)) {
    ws._0_4_ = ZEXT24((ushort)columns.field_2._14_2_);
  }
  iVar2 = isatty(1);
  if (iVar2 == 0) {
    ws.ws_row = 0xffff;
    ws.ws_col = 0xffff;
  }
  bVar1 = GetEnv("COLUMNS",(string *)local_38);
  if ((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    __nptr = (char *)std::__cxx11::string::c_str();
    endptr = (char *)strtol(__nptr,&local_58,0);
    if (((local_58 != (char *)0x0) && ((*local_58 == '\0' && (0 < (long)endptr)))) &&
       ((long)endptr < 1000)) {
      ws._0_4_ = SUB84(endptr,0);
    }
  }
  if ((int)ws._0_4_ < 9) {
    ws.ws_row = 0xffff;
    ws.ws_col = 0xffff;
  }
  std::__cxx11::string::~string((string *)local_38);
  iVar2._0_2_ = ws.ws_row;
  iVar2._2_2_ = ws.ws_col;
  return iVar2;
}

Assistant:

int SystemTools::GetTerminalWidth()
{
  int width = -1;
#ifdef HAVE_TTY_INFO
  struct winsize ws;
  std::string columns; /* Unix98 environment variable */
  if (ioctl(1, TIOCGWINSZ, &ws) != -1 && ws.ws_col > 0 && ws.ws_row > 0) {
    width = ws.ws_col;
  }
  if (!isatty(STDOUT_FILENO)) {
    width = -1;
  }
  if (SystemTools::GetEnv("COLUMNS", columns) && !columns.empty()) {
    long t;
    char* endptr;
    t = strtol(columns.c_str(), &endptr, 0);
    if (endptr && !*endptr && (t > 0) && (t < 1000)) {
      width = static_cast<int>(t);
    }
  }
  if (width < 9) {
    width = -1;
  }
#endif
  return width;
}